

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

uint prvTidytmbstrlen(ctmbstr str)

{
  long lVar1;
  
  lVar1 = 0;
  if (str != (ctmbstr)0x0) {
    for (; str[lVar1] != '\0'; lVar1 = lVar1 + 1) {
    }
  }
  return (uint)lVar1;
}

Assistant:

uint TY_(tmbstrlen)( ctmbstr str )
{
    uint len = 0;
    if ( str ) 
    {
        while ( *str++ )
            ++len;
    }
    return len;
}